

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# implot_items.cpp
# Opt level: O3

void __thiscall
ImPlot::ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>::
ShadedRenderer(ShadedRenderer<ImPlot::GetterYs<int>,_ImPlot::GetterYRef,_ImPlot::TransformerLogLin>
               *this,GetterYs<int> *getter1,GetterYRef *getter2,TransformerLogLin *transformer,
              ImU32 col)

{
  ImVec2 IVar1;
  int iVar2;
  ImPlotPlot *pIVar3;
  GetterYRef *pGVar4;
  TransformerLogLin *pTVar5;
  ImVec2 IVar6;
  ImVec2 IVar7;
  double dVar8;
  double dVar9;
  double dVar10;
  ImPlotContext *pIVar11;
  int iVar12;
  
  this->Getter1 = getter1;
  this->Getter2 = getter2;
  this->Transformer = transformer;
  iVar2 = getter1->Count;
  iVar12 = getter2->Count;
  if (iVar2 < getter2->Count) {
    iVar12 = iVar2;
  }
  this->Prims = iVar12 + -1;
  this->Col = col;
  (this->P11).x = 0.0;
  (this->P11).y = 0.0;
  (this->P12).x = 0.0;
  pIVar11 = GImPlot;
  (this->P12).y = 0.0;
  iVar2 = *(int *)((long)getter1->Ys +
                  (long)((getter1->Offset % iVar2 + iVar2) % iVar2) * (long)getter1->Stride);
  dVar8 = log10((getter1->XScale * 0.0 + getter1->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar11->CurrentPlot;
  dVar9 = (pIVar3->XAxis).Range.Min;
  iVar12 = transformer->YAxis;
  IVar1 = pIVar11->PixelRange[iVar12].Min;
  IVar6.y = (float)(pIVar11->My[iVar12] * ((double)iVar2 - pIVar3->YAxis[iVar12].Range.Min) +
                   (double)IVar1.y);
  IVar6.x = (float)(pIVar11->Mx *
                    (((double)(float)(dVar8 / pIVar11->LogDenX) *
                      ((pIVar3->XAxis).Range.Max - dVar9) + dVar9) - dVar9) + (double)IVar1.x);
  this->P11 = IVar6;
  pIVar11 = GImPlot;
  pGVar4 = this->Getter2;
  pTVar5 = this->Transformer;
  dVar8 = pGVar4->YRef;
  dVar9 = log10((pGVar4->XScale * 0.0 + pGVar4->X0) / (GImPlot->CurrentPlot->XAxis).Range.Min);
  pIVar3 = pIVar11->CurrentPlot;
  dVar10 = (pIVar3->XAxis).Range.Min;
  iVar2 = pTVar5->YAxis;
  IVar1 = pIVar11->PixelRange[iVar2].Min;
  IVar7.y = (float)(pIVar11->My[iVar2] * (dVar8 - pIVar3->YAxis[iVar2].Range.Min) + (double)IVar1.y)
  ;
  IVar7.x = (float)(pIVar11->Mx *
                    (((double)(float)(dVar9 / pIVar11->LogDenX) *
                      ((pIVar3->XAxis).Range.Max - dVar10) + dVar10) - dVar10) + (double)IVar1.x);
  this->P12 = IVar7;
  return;
}

Assistant:

ShadedRenderer(const TGetter1& getter1, const TGetter2& getter2, const TTransformer& transformer, ImU32 col) :
        Getter1(getter1),
        Getter2(getter2),
        Transformer(transformer),
        Prims(ImMin(Getter1.Count, Getter2.Count) - 1),
        Col(col)
    {
        P11 = Transformer(Getter1(0));
        P12 = Transformer(Getter2(0));
    }